

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O1

Sampler * glu::mapGLSampler(Sampler *__return_storage_ptr__,deUint32 wrapS,deUint32 wrapT,
                           deUint32 wrapR,deUint32 minFilter,deUint32 magFilter)

{
  WrapMode WVar1;
  WrapMode WVar2;
  WrapMode WVar3;
  InternalError *pIVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  ulong local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  WVar1 = mapGLWrapMode(wrapS);
  WVar2 = mapGLWrapMode(wrapT);
  WVar3 = mapGLWrapMode(wrapR);
  switch(minFilter) {
  case 0x2700:
    FVar5 = NEAREST_MIPMAP_NEAREST;
    break;
  case 0x2701:
    FVar5 = LINEAR_MIPMAP_NEAREST;
    break;
  case 0x2702:
    FVar5 = NEAREST_MIPMAP_LINEAR;
    break;
  case 0x2703:
    FVar5 = LINEAR_MIPMAP_LINEAR;
    break;
  default:
    FVar5 = NEAREST;
    if (minFilter != 0x2600) {
      if (minFilter != 0x2601) {
        pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
        local_78 = (ulong)minFilter;
        tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_70,&local_78);
        std::operator+(&local_50,"Can\'t map GL min filter mode",&local_70);
        tcu::InternalError::InternalError(pIVar4,&local_50);
        __cxa_throw(pIVar4,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      FVar5 = LINEAR;
    }
  }
  FVar6 = NEAREST;
  if (magFilter != 0x2600) {
    if (magFilter != 0x2601) {
      pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
      local_78 = (ulong)magFilter;
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_70,&local_78);
      std::operator+(&local_50,"Can\'t map GL mag filter mode",&local_70);
      tcu::InternalError::InternalError(pIVar4,&local_50);
      __cxa_throw(pIVar4,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    FVar6 = LINEAR;
  }
  __return_storage_ptr__->wrapS = WVar1;
  __return_storage_ptr__->wrapT = WVar2;
  __return_storage_ptr__->wrapR = WVar3;
  __return_storage_ptr__->minFilter = FVar5;
  __return_storage_ptr__->magFilter = FVar6;
  __return_storage_ptr__->lodThreshold = 0.0;
  __return_storage_ptr__->normalizedCoords = true;
  __return_storage_ptr__->depthStencilMode = MODE_DEPTH;
  __return_storage_ptr__->compare = COMPAREMODE_NONE;
  __return_storage_ptr__->compareChannel = 0;
  *(undefined8 *)&(__return_storage_ptr__->borderColor).v = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 1) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->borderColor).v + 9) = 0;
  return __return_storage_ptr__;
}

Assistant:

tcu::Sampler mapGLSampler (deUint32 wrapS, deUint32 wrapT, deUint32 wrapR, deUint32 minFilter, deUint32 magFilter)
{
	return tcu::Sampler(mapGLWrapMode(wrapS), mapGLWrapMode(wrapT), mapGLWrapMode(wrapR),
						mapGLMinFilterMode(minFilter), mapGLMagFilterMode(magFilter),
						0.0f /* lod threshold */,
						true /* normalized coords */,
						tcu::Sampler::COMPAREMODE_NONE /* no compare */,
						0 /* compare channel */,
						tcu::Vec4(0.0f) /* border color, not used */);
}